

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_mv_bit_cost(MV *mv,MV *ref_mv,int *mvjcost,int **mvcost,int weight)

{
  short sVar1;
  short sVar2;
  
  sVar1 = mv->row - ref_mv->row;
  sVar2 = mv->col - ref_mv->col;
  return ((*mvcost)[sVar1] +
          *(int *)((long)mvjcost + (ulong)((uint)(sVar2 != 0) * 4 + (uint)(sVar1 != 0) * 8)) +
         mvcost[1][sVar2]) * weight + 0x40 >> 7;
}

Assistant:

int av1_mv_bit_cost(const MV *mv, const MV *ref_mv, const int *mvjcost,
                    int *const mvcost[2], int weight) {
  const MV diff = { mv->row - ref_mv->row, mv->col - ref_mv->col };
  return ROUND_POWER_OF_TWO(
      mv_cost(&diff, mvjcost, CONVERT_TO_CONST_MVCOST(mvcost)) * weight, 7);
}